

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefifind.cpp
# Opt level: O2

USTATUS __thiscall
UEFIFind::find(UEFIFind *this,UINT8 mode,bool count,CBString *hexPattern,CBString *result)

{
  UModelIndex index;
  bool bVar1;
  UINT8 UVar2;
  USTATUS UVar3;
  _Base_ptr p_Var4;
  pair<UModelIndex,_UModelIndex> indexes;
  UByteArray data;
  CBString local_e8;
  set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
  files;
  EFI_GUID EStack_98;
  CBString CStack_88;
  CBString local_60;
  UModelIndex root;
  
  files._M_t._M_impl._0_8_ = 0xffffffffffffffff;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  files._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  TreeModel::index((TreeModel *)&root,(char *)this->model,0);
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &files._M_t._M_impl.super__Rb_tree_header._M_header;
  files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Bstrlib::CBString::clear(result);
  index.i = root.i;
  index.r = root.r;
  index.c = root.c;
  index.m = root.m;
  UVar3 = findFileRecursive(this,index,hexPattern,mode,&files);
  if (UVar3 == 0) {
    if (count) {
      if (files._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        usprintf((CBString *)&indexes,"%lu\n");
        Bstrlib::CBString::operator+=(result,(CBString *)&indexes);
        Bstrlib::CBString::~CBString((CBString *)&indexes);
      }
    }
    else {
      for (p_Var4 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &files._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        UByteArray::UByteArray(&data,0x10,'\0');
        indexes.first.r = p_Var4[1]._M_color;
        indexes.first.c = *(int *)&p_Var4[1].field_0x4;
        indexes.first.i = (uint64_t)p_Var4[1]._M_parent;
        indexes.first.m = (TreeModel *)p_Var4[1]._M_left;
        indexes.second._0_8_ = p_Var4[1]._M_right;
        indexes.second.i = *(uint64_t *)(p_Var4 + 2);
        indexes.second.m = (TreeModel *)p_Var4[2]._M_parent;
        bVar1 = TreeModel::hasEmptyHeader(this->model,&indexes.first);
        if (!bVar1) {
          TreeModel::header((UByteArray *)&CStack_88,this->model,&indexes.first);
          UByteArray::left((UByteArray *)&local_e8,(UByteArray *)&CStack_88,0x10);
          std::__cxx11::string::_M_assign((string *)&data);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&CStack_88);
        }
        CStack_88._vptr_CBString = *(_func_int ***)data.d._M_dataplus._M_p;
        CStack_88.super_tagbstring._0_8_ = *(undefined8 *)(data.d._M_dataplus._M_p + 8);
        guidToUString(&local_e8,(EFI_GUID *)&CStack_88,true);
        Bstrlib::CBString::operator+=(result,&local_e8);
        Bstrlib::CBString::~CBString(&local_e8);
        if (((-1 < indexes.second.r) && (-1 < (long)indexes.second._0_8_)) &&
           (indexes.second.m != (TreeModel *)0x0)) {
          UVar2 = TreeModel::subtype(this->model,&indexes.second);
          if (UVar2 == '\x18') {
            TreeModel::header((UByteArray *)&local_e8,this->model,&indexes.second);
            std::__cxx11::string::_M_assign((string *)&data);
            std::__cxx11::string::~string((string *)&local_e8);
            Bstrlib::CBString::CBString(&CStack_88," ");
            EStack_98._0_8_ = *(undefined8 *)(data.d._M_dataplus._M_p + 4);
            EStack_98.Data4 = *(UINT8 (*) [8])(data.d._M_dataplus._M_p + 0xc);
            guidToUString(&local_60,&EStack_98,true);
            Bstrlib::CBString::operator+(&local_e8,&CStack_88,&local_60);
            Bstrlib::CBString::operator+=(result,&local_e8);
            Bstrlib::CBString::~CBString(&local_e8);
            Bstrlib::CBString::~CBString(&local_60);
            Bstrlib::CBString::~CBString(&CStack_88);
          }
        }
        Bstrlib::CBString::CBString(&local_e8,"\n");
        Bstrlib::CBString::operator+=(result,&local_e8);
        Bstrlib::CBString::~CBString(&local_e8);
        std::__cxx11::string::~string((string *)&data);
      }
    }
    UVar3 = 0;
  }
  else {
    UVar3 = 1;
  }
  std::
  _Rb_tree<std::pair<UModelIndex,_UModelIndex>,_std::pair<UModelIndex,_UModelIndex>,_std::_Identity<std::pair<UModelIndex,_UModelIndex>_>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
  ::~_Rb_tree(&files._M_t);
  return UVar3;
}

Assistant:

USTATUS UEFIFind::find(const UINT8 mode, const bool count, const UString & hexPattern, UString & result)
{
    UModelIndex root = model->index(0, 0);
    std::set<std::pair<UModelIndex, UModelIndex> > files;

    result.clear();

    USTATUS returned = findFileRecursive(root, hexPattern, mode, files);
    if (returned)
        return returned;
    
    if (count) {
        if (!files.empty())
            result += usprintf("%lu\n", files.size());
        return U_SUCCESS;
    }

    for (std::set<std::pair<UModelIndex, UModelIndex> >::const_iterator citer = files.begin(); citer != files.end(); ++citer) {
        UByteArray data(16, '\x00');
        std::pair<UModelIndex, UModelIndex> indexes = *citer;
        if (!model->hasEmptyHeader(indexes.first))
            data = model->header(indexes.first).left(16);
        result += guidToUString(readUnaligned((const EFI_GUID*)data.constData()));

        // Special case of freeform subtype GUID files
        if (indexes.second.isValid() && model->subtype(indexes.second) == EFI_SECTION_FREEFORM_SUBTYPE_GUID) {
            data = model->header(indexes.second);
            result += UString(" ") + (guidToUString(readUnaligned((const EFI_GUID*)(data.constData() + sizeof(EFI_COMMON_SECTION_HEADER)))));
        }
        
        result += UString("\n");
    }
    return U_SUCCESS;
}